

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O1

void __thiscall
PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test::
~PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test
          (PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetBorderRouterNotEmpty)
{
    // Make the test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    BorderRouterId newId;

    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.2", 11, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.3", 12, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.4", 13, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    BorderRouter returnValue;

    EXPECT_TRUE(psj.Get(BorderRouterId(3), returnValue) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(psj.Get(BorderRouterId(1), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 1);
    EXPECT_TRUE(returnValue.mAgent.mPort == 12);
    EXPECT_TRUE(returnValue.mAgent.mAddr == "1.1.1.3");

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}